

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

uint ZSTD_countTrailingZeros32(U32 val)

{
  uint uVar1;
  U32 val_local;
  
  if (val != 0) {
    uVar1 = 0;
    for (; (val & 1) == 0; val = val >> 1 | 0x80000000) {
      uVar1 = uVar1 + 1;
    }
    return uVar1;
  }
  __assert_fail("val != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bits.h"
                ,0x1e,"unsigned int ZSTD_countTrailingZeros32(U32)");
}

Assistant:

MEM_STATIC unsigned ZSTD_countTrailingZeros32(U32 val)
{
    assert(val != 0);
#   if defined(_MSC_VER)
#       if STATIC_BMI2 == 1
            return (unsigned)_tzcnt_u32(val);
#       else
            if (val != 0) {
                unsigned long r;
                _BitScanForward(&r, val);
                return (unsigned)r;
            } else {
                /* Should not reach this code path */
                __assume(0);
            }
#       endif
#   elif defined(__GNUC__) && (__GNUC__ >= 4)
        return (unsigned)__builtin_ctz(val);
#   else
        return ZSTD_countTrailingZeros32_fallback(val);
#   endif
}